

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::anon_unknown_1::DescriptorPoolTypeResolver::ResolveEnumType
          (Status *__return_storage_ptr__,DescriptorPoolTypeResolver *this,string *type_url,
          Enum *enum_type)

{
  long lVar1;
  EnumDescriptor *pEVar2;
  SourceContext *this_00;
  EnumValue *this_01;
  stringpiece_ssize_type sVar3;
  RepeatedPtrField<google::protobuf::Option> *extraout_RDX;
  RepeatedPtrField<google::protobuf::Option> *output;
  RepeatedPtrField<google::protobuf::Option> *output_00;
  RepeatedPtrField<google::protobuf::Option> *extraout_RDX_00;
  long lVar4;
  int i;
  long lVar5;
  StringPiece error_message;
  undefined1 local_b0 [8];
  Status status;
  size_t local_80;
  undefined1 local_68 [8];
  string type_name;
  
  local_68 = (undefined1  [8])&type_name._M_string_length;
  type_name._M_dataplus._M_p = (pointer)0x0;
  type_name._M_string_length._0_1_ = 0;
  ParseTypeUrl((Status *)local_b0,this,type_url,(string *)local_68);
  if (local_b0._0_4_ == OK) {
    pEVar2 = DescriptorPool::FindEnumTypeByName(this->pool_,(string *)local_68);
    if (pEVar2 == (EnumDescriptor *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&status.error_message_.field_2 + 8),"Invalid type URL, unknown type: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
      sVar3 = StringPiece::CheckedSsizeTFromSizeT(local_80);
      error_message.length_ = sVar3;
      error_message.ptr_ = (char *)status.error_message_.field_2._8_8_;
      Status::Status(__return_storage_ptr__,NOT_FOUND,error_message);
      std::__cxx11::string::~string((string *)(status.error_message_.field_2._M_local_buf + 8));
    }
    else {
      Enum::Clear(enum_type);
      Enum::_internal_set_name(enum_type,*(string **)(pEVar2 + 8));
      this_00 = Enum::_internal_mutable_source_context(enum_type);
      SourceContext::_internal_set_file_name(this_00,(string *)**(undefined8 **)(pEVar2 + 0x10));
      type_name.field_2._8_8_ = &enum_type->enumvalue_;
      lVar4 = 0x20;
      output = extraout_RDX;
      for (lVar5 = 0; lVar5 < *(int *)(pEVar2 + 0x2c); lVar5 = lVar5 + 1) {
        lVar1 = *(long *)(pEVar2 + 0x30);
        this_01 = RepeatedPtrField<google::protobuf::EnumValue>::Add
                            ((RepeatedPtrField<google::protobuf::EnumValue> *)
                             type_name.field_2._8_8_);
        EnumValue::_internal_set_name(this_01,*(string **)(lVar1 + -0x20 + lVar4));
        this_01->number_ = *(int32 *)(lVar1 + -0x10 + lVar4);
        ConvertOptionsInternal
                  (*(DescriptorPoolTypeResolver **)(lVar1 + lVar4),(Message *)&this_01->options_,
                   output_00);
        lVar4 = lVar4 + 0x28;
        output = extraout_RDX_00;
      }
      ConvertOptionsInternal
                (*(DescriptorPoolTypeResolver **)(pEVar2 + 0x20),(Message *)&enum_type->options_,
                 output);
      Status::Status(__return_storage_ptr__);
    }
  }
  else {
    Status::Status(__return_storage_ptr__,(Status *)local_b0);
  }
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::string::~string((string *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Status ResolveEnumType(const std::string& type_url,
                         Enum* enum_type) override {
    std::string type_name;
    Status status = ParseTypeUrl(type_url, &type_name);
    if (!status.ok()) {
      return status;
    }

    const EnumDescriptor* descriptor = pool_->FindEnumTypeByName(type_name);
    if (descriptor == NULL) {
      return Status(util::error::NOT_FOUND,
                    "Invalid type URL, unknown type: " + type_name);
    }
    ConvertEnumDescriptor(descriptor, enum_type);
    return Status();
  }